

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infoclr_init_data(Pixell fg,Pixell bg,wchar_t op,wchar_t stip)

{
  infoclr *__s;
  unsigned_long gc_mask;
  XGCValues gcv;
  GC gc;
  infoclr *iclr;
  wchar_t stip_local;
  wchar_t op_local;
  Pixell bg_local;
  Pixell fg_local;
  
  __s = Infoclr;
  if (Metadpy->zg < bg) {
    fg_local._4_4_ = -1;
  }
  else if (Metadpy->zg < fg) {
    fg_local._4_4_ = -1;
  }
  else if ((op < L'\0') || (L'\x0f' < op)) {
    fg_local._4_4_ = -1;
  }
  else {
    gcv.plane_mask = fg;
    gcv.foreground = bg;
    if (op == L'\x06') {
      gcv.foreground = 0;
      gcv.plane_mask = bg ^ fg;
    }
    gcv.cap_style = L'\0';
    if (stip != L'\0') {
      gcv.cap_style = L'\x02';
    }
    gcv.font._4_4_ = 0;
    gc_mask._0_4_ = op;
    gcv._120_8_ = XCreateGC(Metadpy->dpy,Metadpy->root,0x1010d,&gc_mask);
    memset(__s,0,0x20);
    __s->gc = (GC)gcv._120_8_;
    __s->field_0x18 = __s->field_0x18 & 0xdf | 0x20;
    __s->fg = fg;
    __s->bg = bg;
    __s->field_0x18 = __s->field_0x18 & 0xf0 | (byte)op & 0xf;
    __s->field_0x18 = __s->field_0x18 & 0xef | (stip != L'\0') << 4;
    fg_local._4_4_ = 0;
  }
  return fg_local._4_4_;
}

Assistant:

static errr Infoclr_init_data(Pixell fg, Pixell bg, int op, int stip)
{
	infoclr *iclr = Infoclr;

	GC gc;
	XGCValues gcv;
	unsigned long gc_mask;

	/*** Simple error checking of opr and clr ***/

	/* Check the 'Pixells' for realism */
	if (bg > Metadpy->zg) return (-1);
	if (fg > Metadpy->zg) return (-1);

	/* Check the data for trueness */
	if ((op < 0) || (op > 15)) return (-1);

	/*** Create the requested 'GC' ***/

	/* Assign the proper GC function */
	gcv.function = op;

	/* Assign the proper GC background */
	gcv.background = bg;

	/* Assign the proper GC foreground */
	gcv.foreground = fg;

	/* Hack -- Handle XOR (xor is code 6) by hacking bg and fg */
	if (op == 6) gcv.background = 0;
	if (op == 6) gcv.foreground = (bg ^ fg);

	/* Assign the proper GC Fill Style */
	gcv.fill_style = (stip ? FillStippled : FillSolid);

	/* Turn off 'Give exposure events for pixmap copying' */
	gcv.graphics_exposures = False;

	/* Set up the GC mask */
	gc_mask = (GCFunction | GCBackground | GCForeground |
	           GCFillStyle | GCGraphicsExposures);

	/* Create the GC detailed above */
	gc = XCreateGC(Metadpy->dpy, Metadpy->root, gc_mask, &gcv);


	/*** Initialize ***/

	/* Wipe the iclr clean */
	(void)memset(iclr, 0, sizeof(infoclr));

	/* Assign the GC */
	iclr->gc = gc;

	/* Nuke it when done */
	iclr->nuke = 1;

	/* Assign the parms */
	iclr->fg = fg;
	iclr->bg = bg;
	iclr->code = op;
	iclr->stip = stip ? 1 : 0;

	/* Success */
	return (0);
}